

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qfilesystemmodel.cpp
# Opt level: O0

void QFileSystemModel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  bool bVar2;
  QFlagsStorageHelper<QFileSystemModel::Option,_4> QVar3;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  void *_v_1;
  void *_v;
  QFileSystemModel *_t;
  QString *in_stack_ffffffffffffff78;
  QString *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  QFileSystemModel *in_stack_ffffffffffffff90;
  QFileSystemModel *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffc8;
  QFlagsStorage<QFileSystemModel::Option> options;
  
  options.i = (Int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    if (in_EDX == 0) {
      rootPathChanged((QFileSystemModel *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    else if (in_EDX == 1) {
      fileRenamed(in_stack_ffffffffffffff90,(QString *)CONCAT44(1,in_stack_ffffffffffffff88),
                  in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    else if (in_EDX == 2) {
      directoryLoaded((QFileSystemModel *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
  }
  if (in_ESI == 5) {
    options.i = 0;
    bVar2 = QtMocHelpers::indexOfMethod<void(QFileSystemModel::*)(QString_const&)>
                      (in_RCX,(void **)rootPathChanged,0,0);
    if (((bVar2) ||
        (bVar2 = QtMocHelpers::
                 indexOfMethod<void(QFileSystemModel::*)(QString_const&,QString_const&,QString_const&)>
                           (in_RCX,(void **)fileRenamed,0,1), bVar2)) ||
       (bVar2 = QtMocHelpers::indexOfMethod<void(QFileSystemModel::*)(QString_const&)>
                          (in_RCX,(void **)directoryLoaded,0,2), bVar2))
    goto switchD_00aab229_default;
  }
  if (in_ESI == 1) {
    in_stack_ffffffffffffff98 = *(QFileSystemModel **)in_RCX;
    in_stack_ffffffffffffff80 = (QString *)(ulong)in_EDX;
    switch(in_stack_ffffffffffffff80) {
    case (QString *)0x0:
      bVar2 = resolveSymlinks((QFileSystemModel *)in_stack_ffffffffffffff80);
      *(bool *)&((QFlagsStorage<QFileSystemModel::Option> *)
                &in_stack_ffffffffffffff98->super_QAbstractItemModel)->i = bVar2;
      break;
    case (QString *)0x1:
      bVar2 = isReadOnly((QFileSystemModel *)in_stack_ffffffffffffff80);
      *(bool *)&((QFlagsStorage<QFileSystemModel::Option> *)
                &in_stack_ffffffffffffff98->super_QAbstractItemModel)->i = bVar2;
      break;
    case (QString *)0x2:
      bVar2 = nameFilterDisables((QFileSystemModel *)in_stack_ffffffffffffff80);
      *(bool *)&((QFlagsStorage<QFileSystemModel::Option> *)
                &in_stack_ffffffffffffff98->super_QAbstractItemModel)->i = bVar2;
      break;
    case (QString *)0x3:
      QVar3.super_QFlagsStorage<QFileSystemModel::Option>.i =
           (QFlagsStorage<QFileSystemModel::Option>)
           QFileSystemModel::options(in_stack_ffffffffffffff90);
      *(QFlagsStorage<QFileSystemModel::Option> *)in_stack_ffffffffffffff98 =
           QVar3.super_QFlagsStorage<QFileSystemModel::Option>.i;
    }
  }
  if (in_ESI == 2) {
    switch(in_EDX) {
    case 0:
      setResolveSymlinks((QFileSystemModel *)in_stack_ffffffffffffff80,false);
      break;
    case 1:
      setReadOnly((QFileSystemModel *)in_stack_ffffffffffffff80,false);
      break;
    case 2:
      setNameFilterDisables((QFileSystemModel *)in_stack_ffffffffffffff80,false);
      break;
    case 3:
      setOptions(in_stack_ffffffffffffff98,(Options)options.i);
    }
  }
switchD_00aab229_default:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileSystemModel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QFileSystemModel *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->rootPathChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->fileRenamed((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[3]))); break;
        case 2: _t->directoryLoaded((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QFileSystemModel::*)(const QString & )>(_a, &QFileSystemModel::rootPathChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFileSystemModel::*)(const QString & , const QString & , const QString & )>(_a, &QFileSystemModel::fileRenamed, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFileSystemModel::*)(const QString & )>(_a, &QFileSystemModel::directoryLoaded, 2))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->resolveSymlinks(); break;
        case 1: *reinterpret_cast<bool*>(_v) = _t->isReadOnly(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->nameFilterDisables(); break;
        case 3: *reinterpret_cast<Options*>(_v) = _t->options(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setResolveSymlinks(*reinterpret_cast<bool*>(_v)); break;
        case 1: _t->setReadOnly(*reinterpret_cast<bool*>(_v)); break;
        case 2: _t->setNameFilterDisables(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setOptions(*reinterpret_cast<Options*>(_v)); break;
        default: break;
        }
    }
}